

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_inverse_field(secp256k1_fe *out,secp256k1_fe *x,int var)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined4 uVar37;
  uint uVar38;
  int iVar39;
  uint extraout_EAX;
  ulong uVar40;
  int extraout_EDX;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  secp256k1_fe *psVar47;
  secp256k1_fe *r;
  ulong uVar48;
  ulong uVar49;
  secp256k1_fe *psVar50;
  secp256k1_fe *a;
  ulong uVar51;
  secp256k1_fe *r_00;
  secp256k1_fe *r_01;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  code *pcVar61;
  ulong uVar62;
  code *pcVar63;
  code *pcVar64;
  uint extraout_XMM0_Da;
  uint uVar65;
  uint extraout_XMM0_Db;
  uint uVar67;
  uint extraout_XMM0_Dc;
  uint uVar68;
  undefined1 auVar66 [16];
  uint extraout_XMM0_Dd;
  uint uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uchar auStack_1e8 [40];
  secp256k1_fe *psStack_1c0;
  code *pcStack_1b8;
  ulong uStack_1b0;
  secp256k1_fe *psStack_1a8;
  code *pcStack_1a0;
  secp256k1_fe *psStack_198;
  code *pcStack_188;
  undefined1 auStack_180 [32];
  secp256k1_fe sStack_160;
  undefined1 auStack_130 [16];
  undefined1 auStack_118 [48];
  undefined8 uStack_e8;
  secp256k1_fe *psStack_e0;
  undefined8 uStack_d8;
  code *pcStack_d0;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  secp256k1_fe local_68;
  
  a = &local_c8;
  psVar47 = &local_c8;
  pcVar61 = secp256k1_fe_inv_var;
  if (var == 0) {
    pcVar61 = secp256k1_fe_inv;
  }
  pcStack_d0 = (code *)0x157791;
  (*pcVar61)(&local_c8);
  if (out != (secp256k1_fe *)0x0) {
    out->n[4] = local_c8.n[4];
    out->magnitude = local_c8.magnitude;
    out->normalized = local_c8.normalized;
    out->n[2] = local_c8.n[2];
    out->n[3] = local_c8.n[3];
    out->n[0] = local_c8.n[0];
    out->n[1] = local_c8.n[1];
  }
  uVar48 = 0xffffffffffff;
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  psVar50 = &local_68;
  pcStack_d0 = (code *)0x1577fa;
  secp256k1_fe_verify(psVar50);
  uVar62 = 0x1000003d1;
  uVar40 = (local_68.n[4] >> 0x30) * 0x1000003d1 + local_68.n[0];
  if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
    uVar41 = (uVar40 >> 0x34) + local_68.n[1];
    uVar49 = (uVar41 >> 0x34) + local_68.n[2];
    uVar51 = (uVar49 >> 0x34) + local_68.n[3];
    uVar52 = (uVar51 >> 0x34) + (local_68.n[4] & 0xffffffffffff);
    if ((((uVar41 | uVar40 | uVar49 | uVar51) & 0xfffffffffffff) != 0 || uVar52 != 0) &&
       (((uVar40 | 0x1000003d0) & uVar41 & uVar49 & uVar51 & (uVar52 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_001578a1;
LAB_00157c6b:
    pcStack_d0 = (code *)0x157c76;
    secp256k1_fe_verify(&local_c8);
    uVar48 = local_c8.n[4] & 0xffffffffffff;
    uVar40 = (local_c8.n[4] >> 0x30) * 0x1000003d1 + local_c8.n[0];
    uVar41 = (uVar40 >> 0x34) + local_c8.n[1];
    uVar49 = (uVar41 >> 0x34) + local_c8.n[2];
    a = (secp256k1_fe *)((uVar49 >> 0x34) + local_c8.n[3]);
    uVar51 = ((ulong)a >> 0x34) + uVar48;
    if ((((uVar41 | uVar40 | uVar49 | (ulong)a) & 0xfffffffffffff) == 0 && uVar51 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar51 ^ 0xf000000000000), psVar47 = &local_c8,
       ((uVar40 ^ 0x1000003d0) & uVar41 & uVar49 & (ulong)a & (ulong)r_00) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_001578a1:
    pcStack_d0 = (code *)0x1578b4;
    psVar50 = x;
    secp256k1_fe_mul(&local_68,x,&local_c8);
    pcStack_d0 = (code *)0x1578bc;
    secp256k1_fe_verify(&local_68);
    r_00 = &fe_minus_one;
    pcStack_d0 = (code *)0x1578c8;
    secp256k1_fe_verify(&fe_minus_one);
    if (local_68.magnitude < 0x20) {
      local_68.n[0] = local_68.n[0] + 0xffffefffffc2e;
      local_68.n[1] = local_68.n[1] + 0xfffffffffffff;
      local_68.n[2] = local_68.n[2] + 0xfffffffffffff;
      local_68.n[3] = local_68.n[3] + 0xfffffffffffff;
      local_68.n[4] = local_68.n[4] + 0xffffffffffff;
      local_68.normalized = 0;
      local_68.magnitude = local_68.magnitude + 1;
      pcStack_d0 = (code *)0x15791a;
      secp256k1_fe_verify(&local_68);
      pcStack_d0 = (code *)0x157922;
      secp256k1_fe_verify(&local_68);
      uVar40 = (local_68.n[4] >> 0x30) * 0x1000003d1 + local_68.n[0];
      uVar41 = (uVar40 >> 0x34) + local_68.n[1];
      uVar49 = (uVar41 >> 0x34) + local_68.n[2];
      psVar50 = (secp256k1_fe *)((uVar49 >> 0x34) + local_68.n[3]);
      uVar51 = ((ulong)psVar50 >> 0x34) + (local_68.n[4] & 0xffffffffffff);
      if ((((uVar41 | uVar40 | uVar49 | (ulong)psVar50) & 0xfffffffffffff) != 0 || uVar51 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar51 ^ 0xf000000000000),
         ((uVar40 ^ 0x1000003d0) & uVar41 & uVar49 & (ulong)psVar50 & (ulong)r_00) !=
         0xfffffffffffff)) goto LAB_00157d09;
      local_98.n[0] = x->n[0];
      local_98.n[1] = x->n[1];
      local_98.n[2] = x->n[2];
      local_98.n[3] = x->n[3];
      local_98.n[4] = x->n[4];
      local_98.magnitude = x->magnitude;
      local_98.normalized = x->normalized;
      x = &local_98;
      pcStack_d0 = (code *)0x1579c8;
      secp256k1_fe_verify(x);
      r_00 = &fe_minus_one;
      pcStack_d0 = (code *)0x1579d4;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < local_98.magnitude) goto LAB_00157d0e;
      local_98.n[0] = local_98.n[0] + 0xffffefffffc2e;
      local_98.n[1] = local_98.n[1] + 0xfffffffffffff;
      local_98.n[2] = local_98.n[2] + 0xfffffffffffff;
      local_98.n[3] = local_98.n[3] + 0xfffffffffffff;
      local_98.n[4] = local_98.n[4] + 0xffffffffffff;
      local_98.normalized = 0;
      local_98.magnitude = local_98.magnitude + 1;
      pcStack_d0 = (code *)0x157a1f;
      secp256k1_fe_verify(&local_98);
      pcStack_d0 = (code *)0x157a27;
      secp256k1_fe_verify(&local_98);
      uVar40 = (local_98.n[4] >> 0x30) * 0x1000003d1 + local_98.n[0];
      if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
        uVar41 = (uVar40 >> 0x34) + local_98.n[1];
        uVar49 = (uVar41 >> 0x34) + local_98.n[2];
        uVar51 = (uVar49 >> 0x34) + local_98.n[3];
        uVar52 = (uVar51 >> 0x34) + (local_98.n[4] & 0xffffffffffff);
        if (((uVar41 | uVar40 | uVar49 | uVar51) & 0xfffffffffffff) == 0 && uVar52 == 0) {
          return;
        }
        if (((uVar40 | 0x1000003d0) & uVar41 & uVar49 & uVar51 & (uVar52 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar50 = &local_98;
      pcStack_d0 = (code *)0x157ad6;
      (*pcVar61)();
      pcStack_d0 = (code *)0x157ae1;
      secp256k1_fe_verify(&local_c8);
      r_00 = &fe_minus_one;
      pcStack_d0 = (code *)0x157aed;
      secp256k1_fe_verify(&fe_minus_one);
      x = &local_c8;
      if (0x1f < local_c8.magnitude) goto LAB_00157d13;
      local_c8.n[0] = local_c8.n[0] + 0xffffefffffc2e;
      local_c8.n[1] = local_c8.n[1] + 0xfffffffffffff;
      local_c8.n[2] = local_c8.n[2] + 0xfffffffffffff;
      local_c8.n[3] = local_c8.n[3] + 0xfffffffffffff;
      local_c8.n[4] = local_c8.n[4] + 0xffffffffffff;
      local_c8.magnitude = local_c8.magnitude + 1;
      local_c8.normalized = 0;
      pcStack_d0 = (code *)0x157b36;
      secp256k1_fe_verify(&local_c8);
      pcStack_d0 = (code *)0x157b3f;
      (*pcVar61)(&local_c8);
      pcStack_d0 = (code *)0x157b47;
      secp256k1_fe_verify(&local_c8);
      local_c8.n[0] = local_c8.n[0] + 1;
      local_c8.magnitude = local_c8.magnitude + 1;
      local_c8.normalized = 0;
      pcStack_d0 = (code *)0x157b59;
      secp256k1_fe_verify(&local_c8);
      pcStack_d0 = (code *)0x157b61;
      secp256k1_fe_verify(&local_c8);
      psVar50 = &local_98;
      pcStack_d0 = (code *)0x157b6e;
      r_00 = psVar50;
      secp256k1_fe_verify(psVar50);
      if (local_98.magnitude + local_c8.magnitude < 0x21) {
        local_c8.n[0] = local_c8.n[0] + local_98.n[0];
        local_c8.n[1] = local_c8.n[1] + local_98.n[1];
        local_c8.n[2] = local_c8.n[2] + local_98.n[2];
        local_c8.n[3] = local_c8.n[3] + local_98.n[3];
        local_c8.n[4] = local_c8.n[4] + local_98.n[4];
        local_c8.normalized = 0;
        pcStack_d0 = (code *)0x157bba;
        local_c8.magnitude = local_98.magnitude + local_c8.magnitude;
        secp256k1_fe_verify(&local_c8);
        pcStack_d0 = (code *)0x157bc2;
        secp256k1_fe_verify(&local_c8);
        uVar40 = (local_c8.n[4] >> 0x30) * 0x1000003d1 + local_c8.n[0];
        if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
          uVar48 = (uVar40 >> 0x34) + local_c8.n[1];
          uVar41 = (uVar48 >> 0x34) + local_c8.n[2];
          uVar49 = (uVar41 >> 0x34) + local_c8.n[3];
          uVar51 = (uVar49 >> 0x34) + (local_c8.n[4] & 0xffffffffffff);
          if (((uVar48 | uVar40 | uVar41 | uVar49) & 0xfffffffffffff) == 0 && uVar51 == 0) {
            return;
          }
          if (((uVar40 | 0x1000003d0) & uVar48 & uVar41 & uVar49 & (uVar51 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_d0 = (code *)0x157c6b;
        test_inverse_field_cold_2();
        goto LAB_00157c6b;
      }
    }
    else {
      pcStack_d0 = (code *)0x157d09;
      test_inverse_field_cold_7();
LAB_00157d09:
      pcStack_d0 = (code *)0x157d0e;
      test_inverse_field_cold_6();
LAB_00157d0e:
      pcStack_d0 = (code *)0x157d13;
      test_inverse_field_cold_5();
LAB_00157d13:
      a = psVar50;
      psVar47 = x;
      psVar50 = &local_68;
      pcStack_d0 = (code *)0x157d18;
      test_inverse_field_cold_4();
    }
    pcStack_d0 = (code *)0x157d1d;
    test_inverse_field_cold_3();
  }
  pcStack_d0 = test_inverse_scalar;
  test_inverse_field_cold_1();
  uStack_d8 = 0xfffffffffffff;
  uStack_e8 = 0x1000003d1;
  pcVar63 = secp256k1_scalar_inverse_var;
  if (extraout_EDX == 0) {
    pcVar63 = secp256k1_scalar_inverse;
  }
  r = (secp256k1_fe *)auStack_180;
  psStack_198 = (secp256k1_fe *)0x157d58;
  r_01 = r;
  auStack_118._32_8_ = psVar47;
  auStack_118._40_8_ = pcVar61;
  psStack_e0 = psVar50;
  pcStack_d0 = (code *)uVar48;
  uVar37 = (*pcVar63)();
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_180._20_4_,auStack_180._16_4_);
    r_00->n[3] = CONCAT44(auStack_180._28_4_,auStack_180._24_4_);
    r_00->n[0] = CONCAT44(auStack_180._4_4_,auStack_180._0_4_);
    r_00->n[1] = CONCAT44(auStack_180._12_4_,auStack_180._8_4_);
  }
  uVar65 = 0;
  uVar67 = 0;
  uVar68 = 0;
  uVar69 = 0;
  auVar70._0_4_ = -(uint)((int)a->n[2] == 0 && (int)a->n[0] == 0);
  auVar70._4_4_ = -(uint)(*(int *)((long)a->n + 0x14) == 0 && *(int *)((long)a->n + 4) == 0);
  auVar70._8_4_ = -(uint)((int)a->n[3] == 0 && (int)a->n[1] == 0);
  auVar70._12_4_ = -(uint)(*(int *)((long)a->n + 0x1c) == 0 && *(int *)((long)a->n + 0xc) == 0);
  uVar38 = movmskps(uVar37,auVar70);
  uVar38 = uVar38 ^ 0xf;
  if (uVar38 != 0) {
    uVar40 = a->n[0];
    uVar48 = a->n[1];
    uVar41 = a->n[2];
    uVar46 = CONCAT44(auStack_180._4_4_,auStack_180._0_4_);
    pcVar61 = (code *)CONCAT44(auStack_180._12_4_,auStack_180._8_4_);
    uVar62 = CONCAT44(auStack_180._20_4_,auStack_180._16_4_);
    r_00 = (secp256k1_fe *)CONCAT44(auStack_180._28_4_,auStack_180._24_4_);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar40;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar46;
    uVar42 = SUB168(auVar2 * auVar18,8);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar42;
    sStack_160.n[0] = SUB168(auVar2 * auVar18,0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar40;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = pcVar61;
    auVar3 = auVar3 * auVar19;
    uVar53 = SUB168(auVar3 + auVar36,0);
    uVar54 = SUB168(auVar3 + auVar36,8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar48;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar46;
    uVar43 = SUB168(auVar4 * auVar20,8);
    uVar52 = SUB168(auVar4 * auVar20,0);
    uVar49 = (ulong)CARRY8(uVar53,uVar52);
    uVar51 = uVar54 + uVar43;
    uVar55 = uVar51 + uVar49;
    uVar57 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar42,auVar3._0_8_)) +
             (ulong)(CARRY8(uVar54,uVar43) || CARRY8(uVar51,uVar49));
    sStack_160.n[1] = uVar53 + uVar52;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar40;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar62;
    uVar44 = SUB168(auVar5 * auVar21,8);
    uVar49 = SUB168(auVar5 * auVar21,0);
    uVar52 = uVar55 + uVar49;
    uVar49 = (ulong)CARRY8(uVar55,uVar49);
    uVar42 = uVar57 + uVar44;
    uVar58 = uVar42 + uVar49;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar48;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = pcVar61;
    uVar55 = SUB168(auVar6 * auVar22,8);
    uVar51 = SUB168(auVar6 * auVar22,0);
    uVar56 = uVar52 + uVar51;
    uVar51 = (ulong)CARRY8(uVar52,uVar51);
    uVar43 = uVar58 + uVar55;
    uVar59 = uVar43 + uVar51;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar41;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar46;
    uVar45 = SUB168(auVar7 * auVar23,8);
    uVar54 = SUB168(auVar7 * auVar23,0);
    uVar52 = (ulong)CARRY8(uVar56,uVar54);
    uVar53 = uVar59 + uVar45;
    uVar60 = uVar53 + uVar52;
    uVar57 = (ulong)(CARRY8(uVar57,uVar44) || CARRY8(uVar42,uVar49)) +
             (ulong)(CARRY8(uVar58,uVar55) || CARRY8(uVar43,uVar51)) +
             (ulong)(CARRY8(uVar59,uVar45) || CARRY8(uVar53,uVar52));
    sStack_160.n[2] = uVar56 + uVar54;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar40;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = r_00;
    uVar54 = SUB168(auVar8 * auVar24,8);
    uVar40 = SUB168(auVar8 * auVar24,0);
    uVar51 = uVar60 + uVar40;
    uVar40 = (ulong)CARRY8(uVar60,uVar40);
    uVar42 = uVar57 + uVar54;
    uVar56 = uVar42 + uVar40;
    pcVar64 = (code *)a->n[3];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar48;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar62;
    uVar44 = SUB168(auVar9 * auVar25,8);
    uVar49 = SUB168(auVar9 * auVar25,0);
    uVar52 = uVar51 + uVar49;
    uVar49 = (ulong)CARRY8(uVar51,uVar49);
    uVar43 = uVar56 + uVar44;
    uVar58 = uVar43 + uVar49;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar41;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = pcVar61;
    uVar55 = SUB168(auVar10 * auVar26,8);
    uVar51 = SUB168(auVar10 * auVar26,0);
    uVar60 = uVar52 + uVar51;
    uVar51 = (ulong)CARRY8(uVar52,uVar51);
    uVar53 = uVar58 + uVar55;
    uVar59 = uVar53 + uVar51;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = pcVar64;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar46;
    uVar45 = SUB168(auVar11 * auVar27,8);
    uVar52 = SUB168(auVar11 * auVar27,0);
    sStack_160.n[3] = uVar60 + uVar52;
    uVar52 = (ulong)CARRY8(uVar60,uVar52);
    uVar46 = uVar59 + uVar45;
    uVar60 = uVar46 + uVar52;
    uVar54 = (ulong)(CARRY8(uVar57,uVar54) || CARRY8(uVar42,uVar40)) +
             (ulong)(CARRY8(uVar56,uVar44) || CARRY8(uVar43,uVar49)) +
             (ulong)(CARRY8(uVar58,uVar55) || CARRY8(uVar53,uVar51)) +
             (ulong)(CARRY8(uVar59,uVar45) || CARRY8(uVar46,uVar52));
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar48;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = r_00;
    uVar43 = SUB168(auVar12 * auVar28,8);
    uVar40 = SUB168(auVar12 * auVar28,0);
    uVar49 = uVar60 + uVar40;
    uVar40 = (ulong)CARRY8(uVar60,uVar40);
    uVar51 = uVar54 + uVar43;
    uVar44 = uVar51 + uVar40;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar41;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar62;
    uVar53 = SUB168(auVar13 * auVar29,8);
    uVar48 = SUB168(auVar13 * auVar29,0);
    uVar42 = uVar49 + uVar48;
    uVar48 = (ulong)CARRY8(uVar49,uVar48);
    uVar52 = uVar44 + uVar53;
    uVar55 = uVar52 + uVar48;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = pcVar64;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = pcVar61;
    uVar46 = SUB168(auVar14 * auVar30,8);
    uVar49 = SUB168(auVar14 * auVar30,0);
    sStack_160.n[4] = uVar42 + uVar49;
    uVar49 = (ulong)CARRY8(uVar42,uVar49);
    uVar42 = uVar55 + uVar46;
    uVar45 = uVar42 + uVar49;
    uVar42 = (ulong)(CARRY8(uVar54,uVar43) || CARRY8(uVar51,uVar40)) +
             (ulong)(CARRY8(uVar44,uVar53) || CARRY8(uVar52,uVar48)) +
             (ulong)(CARRY8(uVar55,uVar46) || CARRY8(uVar42,uVar49));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar41;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = r_00;
    uVar51 = SUB168(auVar15 * auVar31,8);
    uVar40 = SUB168(auVar15 * auVar31,0);
    uVar49 = uVar45 + uVar40;
    uVar40 = (ulong)CARRY8(uVar45,uVar40);
    uVar41 = uVar42 + uVar51;
    uVar43 = uVar41 + uVar40;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pcVar64;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar62;
    uVar52 = SUB168(auVar16 * auVar32,8);
    uVar48 = SUB168(auVar16 * auVar32,0);
    sStack_160._40_8_ = uVar49 + uVar48;
    uVar48 = (ulong)CARRY8(uVar49,uVar48);
    uVar49 = uVar43 + uVar52;
    auStack_130._8_8_ =
         (ulong)(CARRY8(uVar42,uVar51) || CARRY8(uVar41,uVar40)) +
         (ulong)(CARRY8(uVar43,uVar52) || CARRY8(uVar49,uVar48));
    auStack_130._0_8_ = uVar49 + uVar48;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = pcVar64;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = r_00;
    auStack_130 = auVar17 * auVar33 + auStack_130;
    r = (secp256k1_fe *)auStack_118;
    psStack_198 = (secp256k1_fe *)0x157ef3;
    r_01 = r;
    pcStack_188 = pcVar63;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)r,(uint64_t *)(auStack_180 + 0x20));
    if (((auStack_118._0_8_ != 1 || auStack_118._8_8_ != 0) || auStack_118._16_8_ != 0) ||
        auStack_118._24_8_ != 0) {
      psStack_198 = (secp256k1_fe *)0x157fea;
      test_inverse_scalar_cold_1();
      goto LAB_00157fea;
    }
    psStack_198 = (secp256k1_fe *)0x157f23;
    iVar39 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_180 + 0x20),(secp256k1_scalar *)a,
                        &scalar_minus_one);
    pcVar63 = pcStack_188;
    auVar66._0_4_ = -(uint)((int)sStack_160.n[2] == 0 && (int)sStack_160.n[0] == 0);
    auVar66._4_4_ = -(uint)(sStack_160.n[2]._4_4_ == 0 && sStack_160.n[0]._4_4_ == 0);
    auVar66._8_4_ = -(uint)((int)sStack_160.n[3] == 0 && (int)sStack_160.n[1] == 0);
    auVar66._12_4_ = -(uint)(sStack_160.n[3]._4_4_ == 0 && sStack_160.n[1]._4_4_ == 0);
    iVar39 = movmskps(iVar39,auVar66);
    if (iVar39 == 0xf) {
      return;
    }
    r = (secp256k1_fe *)(auStack_180 + 0x20);
    psStack_198 = (secp256k1_fe *)0x157f53;
    (*pcStack_188)(r,r);
    r_00 = (secp256k1_fe *)auStack_180;
    psStack_198 = (secp256k1_fe *)0x157f6a;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,&scalar_minus_one,(secp256k1_scalar *)r_00);
    psStack_198 = (secp256k1_fe *)0x157f73;
    (*pcVar63)(r_00,r_00);
    psStack_198 = (secp256k1_fe *)0x157f85;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,(secp256k1_scalar *)r_00,&secp256k1_scalar_one);
    psStack_198 = (secp256k1_fe *)0x157f93;
    r_01 = r_00;
    iVar39 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)r_00);
    auVar71._0_4_ = -(uint)(auStack_180._16_4_ == 0 && auStack_180._0_4_ == 0);
    auVar71._4_4_ = -(uint)(auStack_180._20_4_ == 0 && auStack_180._4_4_ == 0);
    auVar71._8_4_ = -(uint)(auStack_180._24_4_ == 0 && auStack_180._8_4_ == 0);
    auVar71._12_4_ = -(uint)(auStack_180._28_4_ == 0 && auStack_180._12_4_ == 0);
    iVar39 = movmskps(iVar39,auVar71);
    if (iVar39 == 0xf) {
      return;
    }
    psStack_198 = (secp256k1_fe *)0x157fb7;
    test_inverse_scalar_cold_2();
    uVar38 = extraout_EAX;
    uVar65 = extraout_XMM0_Da;
    uVar67 = extraout_XMM0_Db;
    uVar68 = extraout_XMM0_Dc;
    uVar69 = extraout_XMM0_Dd;
  }
  auVar72._0_4_ = -(uint)((auStack_180._16_4_ | auStack_180._0_4_) == uVar65);
  auVar72._4_4_ = -(uint)((auStack_180._20_4_ | auStack_180._4_4_) == uVar67);
  auVar72._8_4_ = -(uint)((auStack_180._24_4_ | auStack_180._8_4_) == uVar68);
  auVar72._12_4_ = -(uint)((auStack_180._28_4_ | auStack_180._12_4_) == uVar69);
  iVar39 = movmskps(uVar38,auVar72);
  pcVar64 = pcVar63;
  if (iVar39 == 0xf) {
    return;
  }
LAB_00157fea:
  psStack_198 = (secp256k1_fe *)random_fe;
  test_inverse_scalar_cold_3();
  psStack_1c0 = r;
  pcStack_1b8 = pcVar61;
  uStack_1b0 = uVar62;
  psStack_1a8 = r_00;
  pcStack_1a0 = pcVar64;
  psStack_198 = a;
  do {
    secp256k1_testrand256(auStack_1e8);
    secp256k1_fe_impl_set_b32_mod(r_01,auStack_1e8);
    bVar34 = (r_01->n[2] & r_01->n[3] & r_01->n[1]) == 0xfffffffffffff;
    bVar35 = r_01->n[4] == 0xffffffffffff;
    bVar1 = 0xffffefffffc2e < r_01->n[0];
    if (bVar1 && (bVar34 && bVar35)) {
      r_01->magnitude = -1;
    }
    else {
      r_01->magnitude = 1;
      r_01->normalized = 1;
      secp256k1_fe_verify(r_01);
    }
  } while (bVar1 && (bVar34 && bVar35));
  return;
}

Assistant:

static void test_inverse_field(secp256k1_fe* out, const secp256k1_fe* x, int var)
{
    secp256k1_fe l, r, t;

    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, x) ;   /* l = 1/x */
    if (out) *out = l;
    t = *x;                                                    /* t = x */
    if (secp256k1_fe_normalizes_to_zero_var(&t)) {
        CHECK(secp256k1_fe_normalizes_to_zero(&l));
        return;
    }
    secp256k1_fe_mul(&t, x, &l);                               /* t = x*(1/x) */
    secp256k1_fe_add(&t, &fe_minus_one);                       /* t = x*(1/x)-1 */
    CHECK(secp256k1_fe_normalizes_to_zero(&t));                /* x*(1/x)-1 == 0 */
    r = *x;                                                    /* r = x */
    secp256k1_fe_add(&r, &fe_minus_one);                       /* r = x-1 */
    if (secp256k1_fe_normalizes_to_zero_var(&r)) return;
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&r, &r);   /* r = 1/(x-1) */
    secp256k1_fe_add(&l, &fe_minus_one);                       /* l = 1/x-1 */
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, &l);   /* l = 1/(1/x-1) */
    secp256k1_fe_add_int(&l, 1);                               /* l = 1/(1/x-1)+1 */
    secp256k1_fe_add(&l, &r);                                  /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_fe_normalizes_to_zero_var(&l));            /* l == 0 */
}